

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

int Insert_String(FORM *form,int row,char *txt,int len)

{
  FIELD *field;
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  undefined2 *__ptr;
  int iVar4;
  char *buf;
  int iVar5;
  WINDOW_conflict **ppWVar6;
  
  field = form->current;
  buf = field->buf + field->dcols * row;
  pcVar3 = After_End_Of_Data(buf,field->dcols);
  iVar5 = ((int)buf - (int)pcVar3) + field->dcols;
  __ptr = (undefined2 *)malloc(2);
  *__ptr = 0x20;
  if (iVar5 <= len) {
    if ((field->drows + -1 == row) && ((field->status & 8) != 0)) {
      _Var1 = Field_Grown(field,1);
      iVar2 = -1;
      if (!_Var1) goto LAB_003837fb;
      buf = field->buf + (long)row * (long)field->dcols;
    }
    iVar2 = -0xc;
    if (field->drows + -1 <= row) goto LAB_003837fb;
    pcVar3 = Get_Start_Of_Data(buf + (long)~len + (long)field->dcols,len + 1);
    pcVar3 = After_Last_Whitespace_Character(buf,(int)pcVar3 - (int)buf);
    iVar4 = (int)pcVar3 - (int)buf;
    iVar2 = Insert_String(form,row + 1,pcVar3,field->dcols - (iVar5 + iVar4));
    if (iVar2 != 0) goto LAB_003837fb;
    wmove(form->w,row,iVar4);
    wclrtoeol(form->w);
  }
  ppWVar6 = &form->w;
  iVar2 = 0;
  wmove(*ppWVar6,row,0);
  winsnstr(*ppWVar6,txt,len);
  wmove(*ppWVar6,row,len);
  winsnstr(*ppWVar6,__ptr,1);
LAB_003837fb:
  free(__ptr);
  return iVar2;
}

Assistant:

static int Insert_String(FORM *form, int row, char *txt, int len)
{ 
  FIELD  *field    = form->current;
  char *bp         = Address_Of_Row_In_Buffer(field,row);
  int datalen      = (int)(After_End_Of_Data(bp,field->dcols) - bp);
  int freelen      = field->dcols - datalen;
  int requiredlen  = len+1;
  char *split;
  int result = E_REQUEST_DENIED;
  char *Space;

  Space = (char*)malloc(2*sizeof(char));
  strcpy(Space, " ");

  if (freelen >= requiredlen)
    {
      wmove(form->w,row,0);
      winsnstr(form->w,txt,len);
      wmove(form->w,row,len);
      winsnstr(form->w,Space,1);
      free(Space);
      return E_OK;
    }
  else
    { /* we have to move characters on the next line. If we are on the
         last line this may work, if the field is growable */
      if ((row == (field->drows - 1)) && Growable(field))
        {
          if (!Field_Grown(field,1))
            {
            free(Space);
            return(E_SYSTEM_ERROR);
            }
          /* !!!Side-Effect : might be changed due to growth!!! */
          bp = Address_Of_Row_In_Buffer(field,row); 
        }

      if (row < (field->drows - 1)) 
        { 
          split = After_Last_Whitespace_Character(bp,
                    (int)(Get_Start_Of_Data(bp + field->dcols - requiredlen ,
                                            requiredlen) - bp));
          /* split points now to the first character of the portion of the
             line that must be moved to the next line */
          datalen = (int)(split-bp); /* + freelen has to stay on this line   */
          freelen = field->dcols - (datalen + freelen); /* for the next line */

          if ((result=Insert_String(form,row+1,split,freelen))==E_OK) 
            {
              wmove(form->w,row,datalen);
              wclrtoeol(form->w);
              wmove(form->w,row,0);
              winsnstr(form->w,txt,len);
              wmove(form->w,row,len);
              winsnstr(form->w,Space,1);
              free(Space);
              return E_OK;
            }
        }
      free(Space);
      return(result);
    }
}